

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_check_circmod(lys_module *module,char *value,int type)

{
  LY_ECODE ecode;
  byte local_31;
  uint8_t i;
  ly_modules_list *models;
  LY_ECODE code;
  int type_local;
  char *value_local;
  lys_module *module_local;
  
  ecode = LYE_CIRC_INCLUDES;
  if (type != 0) {
    ecode = LYE_CIRC_IMPORTS;
  }
  if (module->name == value) {
    ly_vlog(module->ctx,ecode,LY_VLOG_NONE,(void *)0x0,value);
    module_local._4_4_ = -1;
  }
  else {
    for (local_31 = 0; local_31 < (module->ctx->models).parsing_sub_modules_count;
        local_31 = local_31 + 1) {
      if ((module->ctx->models).parsing_sub_modules[local_31]->name == value) {
        ly_vlog(module->ctx,ecode,LY_VLOG_NONE,(void *)0x0,value);
        return -1;
      }
    }
    module_local._4_4_ = 0;
  }
  return module_local._4_4_;
}

Assistant:

static int
lyp_check_circmod(struct lys_module *module, const char *value, int type)
{
    LY_ECODE code = type ? LYE_CIRC_IMPORTS : LYE_CIRC_INCLUDES;
    struct ly_modules_list *models = &module->ctx->models;
    uint8_t i;

    /* include/import itself */
    if (ly_strequal(module->name, value, 1)) {
        LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
        return -1;
    }

    /* currently parsed modules */
    for (i = 0; i < models->parsing_sub_modules_count; i++) {
        if (ly_strequal(models->parsing_sub_modules[i]->name, value, 1)) {
            LOGVAL(module->ctx, code, LY_VLOG_NONE, NULL, value);
            return -1;
        }
    }

    return 0;
}